

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISpriteBank.cpp
# Opt level: O2

void __thiscall irr::gui::CGUISpriteBank::clear(CGUISpriteBank *this)

{
  pointer ppIVar1;
  ITexture *pIVar2;
  u32 i;
  ulong uVar3;
  
  for (uVar3 = 0;
      ppIVar1 = (this->Textures).m_data.
                super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
      uVar3 < ((ulong)((long)(this->Textures).m_data.
                             super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar1) >> 3 &
              0xffffffff); uVar3 = uVar3 + 1) {
    pIVar2 = ppIVar1[uVar3];
    if (pIVar2 != (ITexture *)0x0) {
      IReferenceCounted::drop
                ((IReferenceCounted *)
                 ((long)&pIVar2->_vptr_ITexture + (long)pIVar2->_vptr_ITexture[0xfffffffffffffffd]))
      ;
    }
  }
  core::array<irr::video::ITexture_*>::clear(&this->Textures);
  core::array<irr::gui::SGUISprite>::clear
            ((array<irr::gui::SGUISprite> *)&(this->super_IGUISpriteBank).field_0x8);
  core::array<irr::core::rect<int>_>::clear(&this->Rectangles);
  return;
}

Assistant:

void CGUISpriteBank::clear()
{
	// drop textures
	for (u32 i = 0; i < Textures.size(); ++i) {
		if (Textures[i])
			Textures[i]->drop();
	}
	Textures.clear();
	Sprites.clear();
	Rectangles.clear();
}